

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTime.c
# Opt level: O1

char * strtime_m(void)

{
  tm *__tp;
  size_t sVar1;
  time_t t;
  time_t local_10;
  
  strftime_m_tmpbuf[0] = '\0';
  strftime_m_tmpbuf[1] = '\0';
  strftime_m_tmpbuf[2] = '\0';
  strftime_m_tmpbuf[3] = '\0';
  strftime_m_tmpbuf[4] = '\0';
  strftime_m_tmpbuf[5] = '\0';
  strftime_m_tmpbuf[6] = '\0';
  strftime_m_tmpbuf[7] = '\0';
  strftime_m_tmpbuf[8] = '\0';
  strftime_m_tmpbuf[9] = '\0';
  strftime_m_tmpbuf[10] = '\0';
  strftime_m_tmpbuf[0xb] = '\0';
  strftime_m_tmpbuf[0xc] = '\0';
  strftime_m_tmpbuf[0xd] = '\0';
  strftime_m_tmpbuf[0xe] = '\0';
  strftime_m_tmpbuf[0xf] = '\0';
  strftime_m_tmpbuf[0x10] = '\0';
  strftime_m_tmpbuf[0x11] = '\0';
  strftime_m_tmpbuf[0x12] = '\0';
  strftime_m_tmpbuf[0x13] = '\0';
  strftime_m_tmpbuf[0x14] = '\0';
  strftime_m_tmpbuf[0x15] = '\0';
  strftime_m_tmpbuf[0x16] = '\0';
  strftime_m_tmpbuf[0x17] = '\0';
  strftime_m_tmpbuf[0x18] = '\0';
  strftime_m_tmpbuf[0x19] = '\0';
  strftime_m_tmpbuf[0x1a] = '\0';
  strftime_m_tmpbuf[0x1b] = '\0';
  strftime_m_tmpbuf[0x1c] = '\0';
  strftime_m_tmpbuf[0x1d] = '\0';
  strftime_m_tmpbuf[0x1e] = '\0';
  strftime_m_tmpbuf[0x1f] = '\0';
  strftime_m_tmpbuf[0x20] = '\0';
  strftime_m_tmpbuf[0x21] = '\0';
  strftime_m_tmpbuf[0x22] = '\0';
  strftime_m_tmpbuf[0x23] = '\0';
  strftime_m_tmpbuf[0x24] = '\0';
  strftime_m_tmpbuf[0x25] = '\0';
  strftime_m_tmpbuf[0x26] = '\0';
  strftime_m_tmpbuf[0x27] = '\0';
  strftime_m_tmpbuf[0x28] = '\0';
  strftime_m_tmpbuf[0x29] = '\0';
  strftime_m_tmpbuf[0x2a] = '\0';
  strftime_m_tmpbuf[0x2b] = '\0';
  strftime_m_tmpbuf[0x2c] = '\0';
  strftime_m_tmpbuf[0x2d] = '\0';
  strftime_m_tmpbuf[0x2e] = '\0';
  strftime_m_tmpbuf[0x2f] = '\0';
  strftime_m_tmpbuf[0x30] = '\0';
  strftime_m_tmpbuf[0x31] = '\0';
  strftime_m_tmpbuf[0x32] = '\0';
  strftime_m_tmpbuf[0x33] = '\0';
  strftime_m_tmpbuf[0x34] = '\0';
  strftime_m_tmpbuf[0x35] = '\0';
  strftime_m_tmpbuf[0x36] = '\0';
  strftime_m_tmpbuf[0x37] = '\0';
  strftime_m_tmpbuf[0x38] = '\0';
  strftime_m_tmpbuf[0x39] = '\0';
  strftime_m_tmpbuf[0x3a] = '\0';
  strftime_m_tmpbuf[0x3b] = '\0';
  strftime_m_tmpbuf[0x3c] = '\0';
  strftime_m_tmpbuf[0x3d] = '\0';
  strftime_m_tmpbuf[0x3e] = '\0';
  strftime_m_tmpbuf[0x3f] = '\0';
  time(&local_10);
  __tp = localtime(&local_10);
  if (__tp != (tm *)0x0) {
    sVar1 = strftime(strftime_m_tmpbuf,0x40,"%Y-%m-%d %H:%M:%S",__tp);
    if (sVar1 == 0) {
      strftime_m_tmpbuf[0x30] = '\0';
      strftime_m_tmpbuf[0x31] = '\0';
      strftime_m_tmpbuf[0x32] = '\0';
      strftime_m_tmpbuf[0x33] = '\0';
      strftime_m_tmpbuf[0x34] = '\0';
      strftime_m_tmpbuf[0x35] = '\0';
      strftime_m_tmpbuf[0x36] = '\0';
      strftime_m_tmpbuf[0x37] = '\0';
      strftime_m_tmpbuf[0x38] = '\0';
      strftime_m_tmpbuf[0x39] = '\0';
      strftime_m_tmpbuf[0x3a] = '\0';
      strftime_m_tmpbuf[0x3b] = '\0';
      strftime_m_tmpbuf[0x3c] = '\0';
      strftime_m_tmpbuf[0x3d] = '\0';
      strftime_m_tmpbuf[0x3e] = '\0';
      strftime_m_tmpbuf[0x3f] = '\0';
      strftime_m_tmpbuf[0x20] = '\0';
      strftime_m_tmpbuf[0x21] = '\0';
      strftime_m_tmpbuf[0x22] = '\0';
      strftime_m_tmpbuf[0x23] = '\0';
      strftime_m_tmpbuf[0x24] = '\0';
      strftime_m_tmpbuf[0x25] = '\0';
      strftime_m_tmpbuf[0x26] = '\0';
      strftime_m_tmpbuf[0x27] = '\0';
      strftime_m_tmpbuf[0x28] = '\0';
      strftime_m_tmpbuf[0x29] = '\0';
      strftime_m_tmpbuf[0x2a] = '\0';
      strftime_m_tmpbuf[0x2b] = '\0';
      strftime_m_tmpbuf[0x2c] = '\0';
      strftime_m_tmpbuf[0x2d] = '\0';
      strftime_m_tmpbuf[0x2e] = '\0';
      strftime_m_tmpbuf[0x2f] = '\0';
      strftime_m_tmpbuf[0x10] = '\0';
      strftime_m_tmpbuf[0x11] = '\0';
      strftime_m_tmpbuf[0x12] = '\0';
      strftime_m_tmpbuf[0x13] = '\0';
      strftime_m_tmpbuf[0x14] = '\0';
      strftime_m_tmpbuf[0x15] = '\0';
      strftime_m_tmpbuf[0x16] = '\0';
      strftime_m_tmpbuf[0x17] = '\0';
      strftime_m_tmpbuf[0x18] = '\0';
      strftime_m_tmpbuf[0x19] = '\0';
      strftime_m_tmpbuf[0x1a] = '\0';
      strftime_m_tmpbuf[0x1b] = '\0';
      strftime_m_tmpbuf[0x1c] = '\0';
      strftime_m_tmpbuf[0x1d] = '\0';
      strftime_m_tmpbuf[0x1e] = '\0';
      strftime_m_tmpbuf[0x1f] = '\0';
      strftime_m_tmpbuf[0] = '\0';
      strftime_m_tmpbuf[1] = '\0';
      strftime_m_tmpbuf[2] = '\0';
      strftime_m_tmpbuf[3] = '\0';
      strftime_m_tmpbuf[4] = '\0';
      strftime_m_tmpbuf[5] = '\0';
      strftime_m_tmpbuf[6] = '\0';
      strftime_m_tmpbuf[7] = '\0';
      strftime_m_tmpbuf[8] = '\0';
      strftime_m_tmpbuf[9] = '\0';
      strftime_m_tmpbuf[10] = '\0';
      strftime_m_tmpbuf[0xb] = '\0';
      strftime_m_tmpbuf[0xc] = '\0';
      strftime_m_tmpbuf[0xd] = '\0';
      strftime_m_tmpbuf[0xe] = '\0';
      strftime_m_tmpbuf[0xf] = '\0';
    }
  }
  return strftime_m_tmpbuf;
}

Assistant:

char* strtime_m(void)
{
#ifndef WINCE
	time_t t;
	struct tm *timeptr = NULL;

	memset(strftime_m_tmpbuf, 0, sizeof(strftime_m_tmpbuf));

	time(&t);
	timeptr = localtime(&t);

	if (timeptr == NULL)
	{
		return strftime_m_tmpbuf;
	}

	// Use strftime to build a customized time string. 
	if (strftime(
		strftime_m_tmpbuf,
		sizeof(strftime_m_tmpbuf),
		"%Y-%m-%d %H:%M:%S",
		timeptr
		) <= 0)
	{
		memset(strftime_m_tmpbuf, 0, sizeof(strftime_m_tmpbuf));
		return strftime_m_tmpbuf;
	}
#else
	int nb = 0;
	TCHAR* tstr = (TCHAR*)calloc(sizeof(strftime_m_tmpbuf), sizeof(TCHAR));

	memset(strftime_m_tmpbuf, 0, sizeof(strftime_m_tmpbuf));

	if (tstr == NULL)
	{
		return strftime_m_tmpbuf;
	}

	memset(tstr, 0, sizeof(strftime_m_tmpbuf)*sizeof(TCHAR));

	// Use GetDateFormat() and GetTimeFormat() to build a customized time string. 
	nb = GetDateFormat(
		MAKELCID(MAKELANGID(LANG_ENGLISH, SUBLANG_ENGLISH_US), SORT_DEFAULT), // Locale.
		0, // Flags.
		NULL, // Current local system date.
		_T("yyyy'-'MM'-'dd' '"), // Format the string. 
		tstr, 
		sizeof(strftime_m_tmpbuf)
		);
	if (nb <= 0)
	{
		free(tstr); tstr = NULL;
		return strftime_m_tmpbuf;
	}

	if (GetTimeFormat(
		MAKELCID(MAKELANGID(LANG_ENGLISH, SUBLANG_ENGLISH_US), SORT_DEFAULT), // Locale.
		0, // Flags.
		NULL, // Current local system time.
		_T("HH':'mm':'ss"), // Format the string. 
		tstr+(nb-1), 
		sizeof(strftime_m_tmpbuf)-(nb-1)
		) <= 0)
	{
		free(tstr); tstr = NULL;
		return strftime_m_tmpbuf;
	}

#ifdef UNICODE
	wcstombs(strftime_m_tmpbuf, tstr, sizeof(strftime_m_tmpbuf));
#else
	memcpy(strftime_m_tmpbuf, tstr, sizeof(strftime_m_tmpbuf));
#endif // UNICODE
	strftime_m_tmpbuf[sizeof(strftime_m_tmpbuf)-1] = 0;
	free(tstr); tstr = NULL;
#endif // !WINCE

	return strftime_m_tmpbuf;
}